

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextstream.cpp
# Opt level: O3

void __thiscall QTextStream::QTextStream(QTextStream *this,QByteArray *array,OpenMode openMode)

{
  QTextStreamPrivate *pQVar1;
  sockaddr *__addr;
  long in_FS_OFFSET;
  Connection local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->_vptr_QTextStream = (_func_int **)&PTR__QTextStream_0069bdc8;
  pQVar1 = (QTextStreamPrivate *)operator_new(0x168);
  QTextStreamPrivate::QTextStreamPrivate(pQVar1,this);
  (this->d_ptr)._M_t.
  super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>._M_t.
  super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>.
  super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl = pQVar1;
  __addr = (sockaddr *)operator_new(0x10);
  QBuffer::QBuffer((QBuffer *)__addr,(QObject *)0x0);
  QBuffer::setData((QBuffer *)__addr,array);
  (**(code **)(*(long *)__addr + 0x68))(__addr);
  pQVar1 = (this->d_ptr)._M_t.
           super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>._M_t.
           super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>.
           super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl;
  pQVar1->device = (QIODevice *)__addr;
  pQVar1->deleteDevice = true;
  QObject::disconnect(&(pQVar1->deviceClosedNotifier).super_QObject,(char *)0x0,(QObject *)0x0,
                      (char *)0x0);
  QObject::connect((int)&local_40,__addr,0x4d6d61);
  QMetaObject::Connection::~Connection(&local_40);
  (pQVar1->deviceClosedNotifier).m_stream = this;
  pQVar1->status = Ok;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QTextStream::QTextStream(const QByteArray &array, OpenMode openMode)
    : d_ptr(new QTextStreamPrivate(this))
{
#if defined (QTEXTSTREAM_DEBUG)
    qDebug("QTextStream::QTextStream(const QByteArray &array == *(%p), openMode = %d)",
           &array, int(openMode.toInt()));
#endif
    QBuffer *buffer = new QBuffer;
    buffer->setData(array);
    buffer->open(openMode);

    Q_D(QTextStream);
    d->device = buffer;
    d->deleteDevice = true;
#ifndef QT_NO_QOBJECT
    d->deviceClosedNotifier.setupDevice(this, d->device);
#endif
    d->status = Ok;
}